

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvtBroadphase.cpp
# Opt level: O1

void __thiscall cbtDbvtBroadphase::collide(cbtDbvtBroadphase *this,cbtDispatcher *dispatcher)

{
  undefined1 *this_00;
  cbtDbvtProxy *pcVar1;
  float *pfVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  cbtDbvtProxy **ppcVar7;
  cbtDbvtNode *pcVar8;
  undefined4 extraout_var;
  long lVar10;
  int iVar11;
  cbtDbvtProxy *data;
  undefined1 auVar12 [16];
  undefined1 in_ZMM1 [64];
  cbtDbvtVolume curAabb;
  undefined1 local_58 [16];
  cbtScalar local_48 [2];
  cbtScalar acStack_40 [4];
  long lVar9;
  
  this_00 = &this->field_0x8;
  cbtDbvt::optimizeIncremental
            ((cbtDbvt *)this_00,(this->m_dupdates * *(int *)&this->field_0x1c) / 100 + 1);
  if (this->m_fixedleft != 0) {
    iVar6 = (this->m_fupdates * *(int *)&this->field_0x5c) / 100 + 1;
    cbtDbvt::optimizeIncremental((cbtDbvt *)&this->field_0x48,iVar6);
    uVar5 = this->m_fixedleft - iVar6;
    this->m_fixedleft = ~((int)uVar5 >> 0x1f) & uVar5;
  }
  iVar6 = this->m_stageCurrent;
  iVar6 = (iVar6 + 1) - ((iVar6 + 1) - (iVar6 + 1 >> 0x1f) & 0xfffffffeU);
  this->m_stageCurrent = iVar6;
  if (this->m_stageRoots[iVar6] != (cbtDbvtProxy *)0x0) {
    data = this->m_stageRoots[iVar6];
    do {
      if (data->links[0] == (cbtDbvtProxy *)0x0) {
        ppcVar7 = this->m_stageRoots + data->stage;
      }
      else {
        ppcVar7 = data->links[0]->links + 1;
      }
      pcVar1 = data->links[1];
      *ppcVar7 = pcVar1;
      if (data->links[1] != (cbtDbvtProxy *)0x0) {
        data->links[1]->links[0] = data->links[0];
      }
      data->links[0] = (cbtDbvtProxy *)0x0;
      data->links[1] = this->m_stageRoots[2];
      if (this->m_stageRoots[2] != (cbtDbvtProxy *)0x0) {
        this->m_stageRoots[2]->links[0] = data;
      }
      this->m_stageRoots[2] = data;
      cbtDbvt::remove((cbtDbvt *)this_00,(char *)data->leaf);
      local_58._0_8_ = *(undefined8 *)(data->super_cbtBroadphaseProxy).m_aabbMin.m_floats;
      local_58._8_8_ = *(undefined8 *)((data->super_cbtBroadphaseProxy).m_aabbMin.m_floats + 2);
      local_48 = *(cbtScalar (*) [2])(data->super_cbtBroadphaseProxy).m_aabbMax.m_floats;
      acStack_40._0_8_ = *(undefined8 *)((data->super_cbtBroadphaseProxy).m_aabbMax.m_floats + 2);
      pcVar8 = cbtDbvt::insert((cbtDbvt *)&this->field_0x48,(cbtDbvtVolume *)local_58,data);
      data->leaf = pcVar8;
      data->stage = 2;
      data = pcVar1;
    } while (pcVar1 != (cbtDbvtProxy *)0x0);
    this->m_fixedleft = *(int *)&this->field_0x5c;
    this->m_needcleanup = true;
  }
  local_58._0_8_ = &PTR__ICollide_00b6f860;
  local_58._8_8_ = this;
  if (this->m_deferedcollide == true) {
    cbtDbvt::collideTTpersistentStack
              ((cbtDbvt *)this_00,*(cbtDbvtNode **)&this->field_0x8,
               *(cbtDbvtNode **)&this->field_0x48,(ICollide *)local_58);
  }
  if (this->m_deferedcollide == true) {
    cbtDbvt::collideTTpersistentStack
              ((cbtDbvt *)this_00,*(cbtDbvtNode **)this_00,*(cbtDbvtNode **)this_00,
               (ICollide *)local_58);
  }
  auVar12 = in_ZMM1._0_16_;
  if (this->m_needcleanup == true) {
    iVar6 = (*(this->m_paircache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback
              [7])();
    auVar12 = in_ZMM1._0_16_;
    lVar9 = CONCAT44(extraout_var,iVar6);
    iVar6 = *(int *)(lVar9 + 4);
    if (0 < iVar6) {
      iVar11 = (this->m_cupdates * iVar6) / 100;
      if (iVar11 < this->m_newpairs) {
        iVar11 = this->m_newpairs;
      }
      if (iVar11 <= iVar6) {
        iVar6 = iVar11;
      }
      if (0 < iVar11) {
        iVar11 = 0;
        do {
          lVar10 = (long)((this->m_cid + iVar11) % *(int *)(lVar9 + 4)) * 0x20;
          pfVar2 = *(float **)(*(long *)(*(long *)(lVar9 + 0x10) + lVar10) + 0x38);
          pfVar3 = *(float **)(*(long *)(*(long *)(lVar9 + 0x10) + 8 + lVar10) + 0x38);
          if ((((pfVar3[4] < *pfVar2) || (pfVar2[4] < *pfVar3)) || (pfVar3[5] < pfVar2[1])) ||
             (((pfVar2[5] < pfVar3[1] || (pfVar3[6] < pfVar2[2])) || (pfVar2[6] < pfVar3[2])))) {
            (*(this->m_paircache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback
              [3])();
            iVar6 = iVar6 + -1;
            iVar11 = iVar11 + -1;
          }
          auVar12 = in_ZMM1._0_16_;
          iVar11 = iVar11 + 1;
        } while (iVar11 < iVar6);
      }
      if (*(int *)(lVar9 + 4) < 1) {
        iVar6 = 0;
      }
      else {
        iVar6 = (iVar6 + this->m_cid) % *(int *)(lVar9 + 4);
      }
      this->m_cid = iVar6;
    }
  }
  this->m_pid = this->m_pid + 1;
  this->m_newpairs = 1;
  this->m_needcleanup = false;
  uVar5 = this->m_updates_call;
  auVar4 = vcvtusi2ss_avx512f(auVar12,this->m_updates_done);
  auVar12 = vcvtusi2ss_avx512f(auVar12,uVar5);
  this->m_updates_ratio = (cbtScalar)((uint)(uVar5 != 0) * (int)(auVar4._0_4_ / auVar12._0_4_));
  this->m_updates_done = this->m_updates_done >> 1;
  this->m_updates_call = uVar5 >> 1;
  return;
}

Assistant:

void cbtDbvtBroadphase::collide(cbtDispatcher* dispatcher)
{
	/*printf("---------------------------------------------------------\n");
	printf("m_sets[0].m_leaves=%d\n",m_sets[0].m_leaves);
	printf("m_sets[1].m_leaves=%d\n",m_sets[1].m_leaves);
	printf("numPairs = %d\n",getOverlappingPairCache()->getNumOverlappingPairs());
	{
		int i;
		for (i=0;i<getOverlappingPairCache()->getNumOverlappingPairs();i++)
		{
			printf("pair[%d]=(%d,%d),",i,getOverlappingPairCache()->getOverlappingPairArray()[i].m_pProxy0->getUid(),
				getOverlappingPairCache()->getOverlappingPairArray()[i].m_pProxy1->getUid());
		}
		printf("\n");
	}
*/

	SPC(m_profiling.m_total);
	/* optimize				*/
	m_sets[0].optimizeIncremental(1 + (m_sets[0].m_leaves * m_dupdates) / 100);
	if (m_fixedleft)
	{
		const int count = 1 + (m_sets[1].m_leaves * m_fupdates) / 100;
		m_sets[1].optimizeIncremental(1 + (m_sets[1].m_leaves * m_fupdates) / 100);
		m_fixedleft = cbtMax<int>(0, m_fixedleft - count);
	}
	/* dynamic -> fixed set	*/
	m_stageCurrent = (m_stageCurrent + 1) % STAGECOUNT;
	cbtDbvtProxy* current = m_stageRoots[m_stageCurrent];
	if (current)
	{
#if DBVT_BP_ACCURATESLEEPING
		cbtDbvtTreeCollider collider(this);
#endif
		do
		{
			cbtDbvtProxy* next = current->links[1];
			listremove(current, m_stageRoots[current->stage]);
			listappend(current, m_stageRoots[STAGECOUNT]);
#if DBVT_BP_ACCURATESLEEPING
			m_paircache->removeOverlappingPairsContainingProxy(current, dispatcher);
			collider.proxy = current;
			cbtDbvt::collideTV(m_sets[0].m_root, current->aabb, collider);
			cbtDbvt::collideTV(m_sets[1].m_root, current->aabb, collider);
#endif
			m_sets[0].remove(current->leaf);
			ATTRIBUTE_ALIGNED16(cbtDbvtVolume)
			curAabb = cbtDbvtVolume::FromMM(current->m_aabbMin, current->m_aabbMax);
			current->leaf = m_sets[1].insert(curAabb, current);
			current->stage = STAGECOUNT;
			current = next;
		} while (current);
		m_fixedleft = m_sets[1].m_leaves;
		m_needcleanup = true;
	}
	/* collide dynamics		*/
	{
		cbtDbvtTreeCollider collider(this);
		if (m_deferedcollide)
		{
			SPC(m_profiling.m_fdcollide);
			m_sets[0].collideTTpersistentStack(m_sets[0].m_root, m_sets[1].m_root, collider);
		}
		if (m_deferedcollide)
		{
			SPC(m_profiling.m_ddcollide);
			m_sets[0].collideTTpersistentStack(m_sets[0].m_root, m_sets[0].m_root, collider);
		}
	}
	/* clean up				*/
	if (m_needcleanup)
	{
		SPC(m_profiling.m_cleanup);
		cbtBroadphasePairArray& pairs = m_paircache->getOverlappingPairArray();
		if (pairs.size() > 0)
		{
			int ni = cbtMin(pairs.size(), cbtMax<int>(m_newpairs, (pairs.size() * m_cupdates) / 100));
			for (int i = 0; i < ni; ++i)
			{
				cbtBroadphasePair& p = pairs[(m_cid + i) % pairs.size()];
				cbtDbvtProxy* pa = (cbtDbvtProxy*)p.m_pProxy0;
				cbtDbvtProxy* pb = (cbtDbvtProxy*)p.m_pProxy1;
				if (!Intersect(pa->leaf->volume, pb->leaf->volume))
				{
#if DBVT_BP_SORTPAIRS
					if (pa->m_uniqueId > pb->m_uniqueId)
						cbtSwap(pa, pb);
#endif
					m_paircache->removeOverlappingPair(pa, pb, dispatcher);
					--ni;
					--i;
				}
			}
			if (pairs.size() > 0)
				m_cid = (m_cid + ni) % pairs.size();
			else
				m_cid = 0;
		}
	}
	++m_pid;
	m_newpairs = 1;
	m_needcleanup = false;
	if (m_updates_call > 0)
	{
		m_updates_ratio = m_updates_done / (cbtScalar)m_updates_call;
	}
	else
	{
		m_updates_ratio = 0;
	}
	m_updates_done /= 2;
	m_updates_call /= 2;
}